

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiArea::closeAllSubWindows(QMdiArea *this)

{
  QMdiAreaPrivate *this_00;
  long lVar1;
  Data *pDVar2;
  bool bVar3;
  int __fd;
  QPointer<QMdiSubWindow> *pQVar4;
  QPointer<QMdiSubWindow> *pQVar5;
  QWidget *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lVar1 = (this_00->childWindows).d.size;
  if (lVar1 == 0) goto LAB_00442406;
  this_00->isSubWindowsTiled = false;
  local_48.d = (this_00->childWindows).d.d;
  pQVar5 = (this_00->childWindows).d.ptr;
  local_48.ptr = pQVar5;
  local_48.size = lVar1;
  if (local_48.d == (Data *)0x0) {
LAB_004423af:
    pQVar4 = pQVar5 + lVar1;
    do {
      pDVar2 = (pQVar5->wp).d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        this_01 = (QWidget *)0x0;
      }
      else {
        this_01 = (QWidget *)(pQVar5->wp).value;
      }
      __fd = 0x6da6ad;
      bVar3 = sanityCheck((QMdiSubWindow *)this_01,"QMdiArea::closeAllSubWindows");
      if (bVar3) {
        QWidget::close(this_01,__fd);
      }
      pQVar5 = pQVar5 + 1;
    } while (pQVar5 != pQVar4);
  }
  else {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (lVar1 != 0) goto LAB_004423af;
  }
  QMdiAreaPrivate::updateScrollBars(this_00);
  QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_48);
LAB_00442406:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiArea::closeAllSubWindows()
{
    Q_D(QMdiArea);
    if (d->childWindows.isEmpty())
        return;

    d->isSubWindowsTiled = false;
    // Take a copy because the child->close() call below may end up indirectly calling
    // QCoreApplication::send{Spontaneous}Event(), which may call unknown code that
    // could e.g. recurse into the class modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::closeAllSubWindows"))
            continue;
        child->close();
    }

    d->updateScrollBars();
}